

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::QWidgetWindow(QWidgetWindow *this,QWidget *widget)

{
  bool bVar1;
  QWidgetWindow *this_00;
  ulong uVar2;
  offset_in_QWidgetWindow_to_subr *in_RSI;
  ContextType *in_RDI;
  long in_FS_OFFSET;
  ConnectionType unaff_retaddr;
  SurfaceType type;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QWidgetWindowPrivate *in_stack_ffffffffffffff70;
  Connection *pCVar3;
  QPlatformBackingStoreRhiConfig *in_stack_ffffffffffffff78;
  ContextType *context;
  Object *in_stack_ffffffffffffffc0;
  Connection local_30;
  code *local_28;
  offset_in_QWindow_to_subr signal;
  Connection local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  context = in_RDI;
  this_00 = (QWidgetWindow *)operator_new(0x180);
  memset(this_00,0,0x180);
  QWidgetWindowPrivate::QWidgetWindowPrivate(in_stack_ffffffffffffff70);
  QWindow::QWindow(&in_RDI->super_QWindow,(QWindowPrivate *)this_00,(QWindow *)0x0);
  *(undefined ***)in_RDI = &PTR_metaObject_00d08e58;
  *(undefined ***)&in_RDI->field_0x10 = &PTR__QWidgetWindow_00d08f90;
  QPointer<QWidget>::QPointer<void>
            ((QPointer<QWidget> *)in_stack_ffffffffffffff70,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)0x3b30eb);
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)0x3b30f9);
  updateObjectName(this_00);
  uVar2 = QCoreApplication::testAttribute(AA_ForceRasterWidgets);
  if ((uVar2 & 1) == 0) {
    local_c = 0;
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b312a);
    bVar1 = q_evaluateRhiConfig((QWidget *)this_00,in_stack_ffffffffffffff78,
                                (SurfaceType *)in_stack_ffffffffffffff70);
    if (bVar1) {
      QWindow::setSurfaceType((SurfaceType)in_RDI);
    }
  }
  local_28 = updateObjectName;
  signal = 0;
  pCVar3 = &local_18;
  QObject::
  connect<void(QObject::*)(QString_const&,QObject::QPrivateSignal),void(QWidgetWindow::*)()>
            (in_stack_ffffffffffffffc0,0,context,in_RSI,unaff_retaddr);
  QMetaObject::Connection::~Connection(pCVar3);
  pCVar3 = &local_30;
  QObject::connect<void(QWindow::*)(QScreen*),void(QWidgetWindow::*)()>
            ((Object *)handleScreenChange,signal,context,in_RSI,unaff_retaddr);
  QMetaObject::Connection::~Connection(pCVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QWidgetWindow::QWidgetWindow(QWidget *widget)
    : QWindow(*new QWidgetWindowPrivate(), nullptr)
    , m_widget(widget)
{
    updateObjectName();
    if (!QCoreApplication::testAttribute(Qt::AA_ForceRasterWidgets)) {
        QSurface::SurfaceType type = QSurface::RasterSurface;
        if (q_evaluateRhiConfig(m_widget, nullptr, &type))
            setSurfaceType(type);
    }

    connect(widget, &QObject::objectNameChanged, this, &QWidgetWindow::updateObjectName);
    connect(this, &QWidgetWindow::screenChanged, this, &QWidgetWindow::handleScreenChange);
}